

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.hpp
# Opt level: O0

void __thiscall
diy::Master::Command<Block>::Command(Command<Block> *this,Callback<Block> *f_,Skip *s_)

{
  function<void_(Block_*,_const_diy::Master::ProxyWithLink_&)> *in_RSI;
  BaseCommand *in_RDI;
  function<void_(Block_*,_const_diy::Master::ProxyWithLink_&)> *this_00;
  
  BaseCommand::BaseCommand(in_RDI);
  in_RDI->_vptr_BaseCommand = (_func_int **)&PTR__Command_001c1c98;
  this_00 = (function<void_(Block_*,_const_diy::Master::ProxyWithLink_&)> *)(in_RDI + 1);
  std::function<void_(Block_*,_const_diy::Master::ProxyWithLink_&)>::function(this_00,in_RSI);
  std::function<bool_(int,_const_diy::Master_&)>::function
            ((function<bool_(int,_const_diy::Master_&)> *)this_00,
             (function<bool_(int,_const_diy::Master_&)> *)in_RSI);
  return;
}

Assistant:

Command(Callback<Block> f_, const Skip& s_):
                  f(f_), s(s_)                                                        {}